

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallsList.cpp
# Opt level: O1

SimpleString __thiscall
MockExpectedCallsList::fulfilledCallsToString(MockExpectedCallsList *this,SimpleString *linePrefix)

{
  char cVar1;
  SimpleString *in_RDX;
  size_t extraout_RDX;
  undefined8 *puVar2;
  SimpleString SVar3;
  SimpleString str;
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  
  SimpleString::SimpleString(&local_60,"");
  puVar2 = (undefined8 *)linePrefix->bufferSize_;
  if (puVar2 != (undefined8 *)0x0) {
    do {
      cVar1 = (**(code **)(*(long *)*puVar2 + 0x180))();
      if (cVar1 != '\0') {
        (**(code **)(*(long *)*puVar2 + 0x1e0))(&local_50);
        appendStringOnANewLine(&local_40,&local_60,in_RDX);
        SimpleString::operator=(&local_60,&local_40);
        SimpleString::~SimpleString(&local_40);
        SimpleString::~SimpleString(&local_50);
      }
      puVar2 = (undefined8 *)puVar2[1];
    } while (puVar2 != (undefined8 *)0x0);
  }
  stringOrNoneTextWhenEmpty((SimpleString *)this,&local_60);
  SimpleString::~SimpleString(&local_60);
  SVar3.bufferSize_ = extraout_RDX;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString MockExpectedCallsList::fulfilledCallsToString(const SimpleString& linePrefix) const
{
    SimpleString str;

    for (MockExpectedCallsListNode* p = head_; p; p = p->next_)
        if (p->expectedCall_->isFulfilled())
            str = appendStringOnANewLine(str, linePrefix, p->expectedCall_->callToString());

    return stringOrNoneTextWhenEmpty(str, linePrefix);
}